

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_line_progressed(Parser *this,size_t ahead)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  basic_substring<const_char> *pbVar7;
  State *pSVar8;
  char msg [74];
  basic_substring<const_char> local_68 [4];
  undefined2 local_20;
  
  pSVar8 = this->m_state;
  (pSVar8->pos).super_LineCol.offset = (pSVar8->pos).super_LineCol.offset + ahead;
  uVar4 = (pSVar8->pos).super_LineCol.col + ahead;
  (pSVar8->pos).super_LineCol.col = uVar4;
  if ((pSVar8->line_contents).stripped.len + 1 < uVar4) {
    pcVar6 = "check failed: (m_state->pos.col <= m_state->line_contents.stripped.len+1)";
    pbVar7 = local_68;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pbVar7->str = *(char **)pcVar6;
      pcVar6 = pcVar6 + 8;
      pbVar7 = (basic_substring<const_char> *)&pbVar7->len;
    }
    local_20 = 0x29;
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x769f) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x769f) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)local_68,0x4a,LVar2,(this->m_stack).m_callbacks.m_user_data);
    pSVar8 = this->m_state;
  }
  uVar4 = (pSVar8->line_contents).rem.len;
  if (ahead <= uVar4) {
    basic_substring<const_char>::basic_substring
              (local_68,(pSVar8->line_contents).rem.str + ahead,uVar4 - ahead);
    (pSVar8->line_contents).rem.str = local_68[0].str;
    (pSVar8->line_contents).rem.len = local_68[0].len;
    return;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
  }
  handle_error(0x1fa937,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

void Parser::_line_progressed(size_t ahead)
{
    _c4dbgpf("line[{}] ({} cols) progressed by {}:  col {}-->{}   offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, ahead, m_state->pos.col, m_state->pos.col+ahead, m_state->pos.offset, m_state->pos.offset+ahead);
    m_state->pos.offset += ahead;
    m_state->pos.col += ahead;
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col <= m_state->line_contents.stripped.len+1);
    m_state->line_contents.rem = m_state->line_contents.rem.sub(ahead);
}